

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_fp_denorm(Impl *this)

{
  bool bVar1;
  Function *this_00;
  Builder *pBVar2;
  Function *pFVar3;
  undefined1 local_48 [8];
  String str;
  Attribute attr;
  Function *func;
  Impl *this_local;
  
  this_00 = get_entry_point_function(this->entry_point_meta);
  if (this_00 != (Function *)0x0) {
    str.field_2._8_8_ = LLVMBC::Function::getFnAttribute(this_00,"fp32-denorm-mode");
    LLVMBC::Attribute::getValueAsString_abi_cxx11_
              ((String *)local_48,(Attribute *)((long)&str.field_2 + 8));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                             *)local_48,"ftz");
    if (bVar1) {
      pBVar2 = builder(this);
      spv::Builder::addExtension(pBVar2,"SPV_KHR_float_controls");
      pBVar2 = builder(this);
      spv::Builder::addCapability(pBVar2,CapabilityDenormFlushToZero);
      pBVar2 = builder(this);
      pFVar3 = SPIRVModule::get_entry_function(this->spirv_module);
      spv::Builder::addExecutionMode(pBVar2,pFVar3,ExecutionModeDenormFlushToZero,0x20,-1,-1);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                               *)local_48,"preserve");
      if (bVar1) {
        pBVar2 = builder(this);
        spv::Builder::addExtension(pBVar2,"SPV_KHR_float_controls");
        pBVar2 = builder(this);
        spv::Builder::addCapability(pBVar2,CapabilityDenormPreserve);
        pBVar2 = builder(this);
        pFVar3 = SPIRVModule::get_entry_function(this->spirv_module);
        spv::Builder::addExecutionMode(pBVar2,pFVar3,ExecutionModeDenormPreserve,0x20,-1,-1);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)local_48);
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_fp_denorm()
{
	// Check for SM 6.2 denorm handling. Only applies to FP32.
	auto *func = get_entry_point_function(entry_point_meta);
	if (!func)
		return true;

	auto attr = func->getFnAttribute("fp32-denorm-mode");
	auto str = attr.getValueAsString();
	if (str == "ftz")
	{
		builder().addExtension("SPV_KHR_float_controls");
		builder().addCapability(spv::CapabilityDenormFlushToZero);
		builder().addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormFlushToZero, 32);
	}
	else if (str == "preserve")
	{
		builder().addExtension("SPV_KHR_float_controls");
		builder().addCapability(spv::CapabilityDenormPreserve);
		builder().addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 32);
	}

	return true;
}